

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

int AllocateMemory(VP8Decoder *dec)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t __n;
  long lVar4;
  size_t __n_00;
  long lVar5;
  long lVar6;
  uint64_t size;
  void *pvVar7;
  VP8TopSamples *pVVar8;
  uint8_t *puVar9;
  VP8MBData *pVVar10;
  VP8Decoder *in_RDI;
  int extra_uv;
  int extra_y;
  int extra_rows;
  uint8_t *mem;
  uint64_t needed;
  uint64_t alpha_size;
  size_t cache_size;
  size_t cache_height;
  size_t mb_data_size;
  size_t yuv_size;
  size_t f_info_size;
  size_t mb_info_size;
  size_t top_size;
  size_t intra_pred_mode_size;
  int mb_w;
  int num_caches;
  size_t in_stack_ffffffffffffff60;
  VP8Decoder *dec_00;
  uint64_t in_stack_ffffffffffffff68;
  VP8FInfo *pVVar11;
  long local_90;
  long local_88;
  int local_4;
  
  iVar2 = in_RDI->num_caches_;
  iVar3 = in_RDI->mb_w_;
  __n = (size_t)(iVar3 << 2);
  lVar4 = (long)iVar3;
  __n_00 = (long)(iVar3 + 1) * 2;
  if (in_RDI->filter_type_ < 1) {
    local_88 = 0;
  }
  else {
    iVar1 = 1;
    if (0 < in_RDI->mt_method_) {
      iVar1 = 2;
    }
    local_88 = (long)(iVar3 * iVar1) << 2;
  }
  iVar1 = 1;
  if (in_RDI->mt_method_ == 2) {
    iVar1 = 2;
  }
  lVar5 = (long)(iVar1 * iVar3);
  lVar6 = lVar4 * 0x20 * (long)((int)((iVar2 * 0x10 + (uint)""[in_RDI->filter_type_]) * 3) / 2);
  if (in_RDI->alpha_data_ == (uint8_t *)0x0) {
    local_90 = 0;
  }
  else {
    local_90 = (ulong)(in_RDI->pic_hdr_).width_ * (ulong)(in_RDI->pic_hdr_).height_;
  }
  size = __n + lVar4 * 0x20 + __n_00 + local_88 + lVar5 * 800 + lVar6 + local_90 + 0x35f;
  iVar1 = CheckSizeOverflow(size);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    if (in_RDI->mem_size_ < size) {
      WebPSafeFree((void *)0x1611d7);
      in_RDI->mem_size_ = 0;
      pvVar7 = WebPSafeMalloc(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      in_RDI->mem_ = pvVar7;
      if (in_RDI->mem_ == (void *)0x0) {
        iVar2 = VP8SetError(in_RDI,VP8_STATUS_OUT_OF_MEMORY,"no memory during frame initialization."
                           );
        return iVar2;
      }
      in_RDI->mem_size_ = size;
    }
    in_RDI->intra_t_ = (uint8_t *)in_RDI->mem_;
    pVVar8 = (VP8TopSamples *)((long)in_RDI->mem_ + __n);
    in_RDI->yuv_t_ = pVVar8;
    in_RDI->mb_info_ = (VP8MB *)(pVVar8[lVar4].y + 2);
    pVVar11 = (VP8FInfo *)(pVVar8[lVar4].y + __n_00);
    if (local_88 == 0) {
      pVVar11 = (VP8FInfo *)0x0;
    }
    in_RDI->f_info_ = pVVar11;
    (in_RDI->thread_ctx_).id_ = 0;
    (in_RDI->thread_ctx_).f_info_ = in_RDI->f_info_;
    if ((0 < in_RDI->filter_type_) && (0 < in_RDI->mt_method_)) {
      (in_RDI->thread_ctx_).f_info_ = (in_RDI->thread_ctx_).f_info_ + iVar3;
    }
    puVar9 = (uint8_t *)
             ((ulong)(&((VP8FInfo *)(pVVar8[lVar4].y + __n_00))[7].hev_thresh_ + local_88) &
             0xffffffffffffffe0);
    in_RDI->yuv_b_ = puVar9;
    pVVar10 = (VP8MBData *)(puVar9 + 0x340);
    in_RDI->mb_data_ = pVVar10;
    (in_RDI->thread_ctx_).mb_data_ = pVVar10;
    if (in_RDI->mt_method_ == 2) {
      (in_RDI->thread_ctx_).mb_data_ = (in_RDI->thread_ctx_).mb_data_ + iVar3;
    }
    in_RDI->cache_y_stride_ = iVar3 << 4;
    in_RDI->cache_uv_stride_ = iVar3 << 3;
    iVar3 = (""[in_RDI->filter_type_] / 2) * in_RDI->cache_uv_stride_;
    in_RDI->cache_y_ =
         (uint8_t *)
         ((long)pVVar10[lVar5].coeffs_ +
         (long)(int)((uint)""[in_RDI->filter_type_] * in_RDI->cache_y_stride_));
    in_RDI->cache_u_ =
         in_RDI->cache_y_ + (long)iVar3 + (long)(iVar2 * 0x10 * in_RDI->cache_y_stride_);
    in_RDI->cache_v_ = in_RDI->cache_u_ + (long)iVar3 + (long)(iVar2 * 8 * in_RDI->cache_uv_stride_)
    ;
    in_RDI->cache_id_ = 0;
    dec_00 = (VP8Decoder *)((long)pVVar10[lVar5].coeffs_ + lVar6);
    if (local_90 == 0) {
      dec_00 = (VP8Decoder *)0x0;
    }
    in_RDI->alpha_plane_ = (uint8_t *)dec_00;
    memset(in_RDI->mb_info_ + -1,0,__n_00);
    VP8InitScanline(dec_00);
    memset(in_RDI->intra_t_,0,__n);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int AllocateMemory(VP8Decoder* const dec) {
  const int num_caches = dec->num_caches_;
  const int mb_w = dec->mb_w_;
  // Note: we use 'size_t' when there's no overflow risk, uint64_t otherwise.
  const size_t intra_pred_mode_size = 4 * mb_w * sizeof(uint8_t);
  const size_t top_size = sizeof(VP8TopSamples) * mb_w;
  const size_t mb_info_size = (mb_w + 1) * sizeof(VP8MB);
  const size_t f_info_size =
      (dec->filter_type_ > 0) ?
          mb_w * (dec->mt_method_ > 0 ? 2 : 1) * sizeof(VP8FInfo)
        : 0;
  const size_t yuv_size = YUV_SIZE * sizeof(*dec->yuv_b_);
  const size_t mb_data_size =
      (dec->mt_method_ == 2 ? 2 : 1) * mb_w * sizeof(*dec->mb_data_);
  const size_t cache_height = (16 * num_caches
                            + kFilterExtraRows[dec->filter_type_]) * 3 / 2;
  const size_t cache_size = top_size * cache_height;
  // alpha_size is the only one that scales as width x height.
  const uint64_t alpha_size = (dec->alpha_data_ != NULL) ?
      (uint64_t)dec->pic_hdr_.width_ * dec->pic_hdr_.height_ : 0ULL;
  const uint64_t needed = (uint64_t)intra_pred_mode_size
                        + top_size + mb_info_size + f_info_size
                        + yuv_size + mb_data_size
                        + cache_size + alpha_size + WEBP_ALIGN_CST;
  uint8_t* mem;

  if (!CheckSizeOverflow(needed)) return 0;  // check for overflow
  if (needed > dec->mem_size_) {
    WebPSafeFree(dec->mem_);
    dec->mem_size_ = 0;
    dec->mem_ = WebPSafeMalloc(needed, sizeof(uint8_t));
    if (dec->mem_ == NULL) {
      return VP8SetError(dec, VP8_STATUS_OUT_OF_MEMORY,
                         "no memory during frame initialization.");
    }
    // down-cast is ok, thanks to WebPSafeMalloc() above.
    dec->mem_size_ = (size_t)needed;
  }

  mem = (uint8_t*)dec->mem_;
  dec->intra_t_ = mem;
  mem += intra_pred_mode_size;

  dec->yuv_t_ = (VP8TopSamples*)mem;
  mem += top_size;

  dec->mb_info_ = ((VP8MB*)mem) + 1;
  mem += mb_info_size;

  dec->f_info_ = f_info_size ? (VP8FInfo*)mem : NULL;
  mem += f_info_size;
  dec->thread_ctx_.id_ = 0;
  dec->thread_ctx_.f_info_ = dec->f_info_;
  if (dec->filter_type_ > 0 && dec->mt_method_ > 0) {
    // secondary cache line. The deblocking process need to make use of the
    // filtering strength from previous macroblock row, while the new ones
    // are being decoded in parallel. We'll just swap the pointers.
    dec->thread_ctx_.f_info_ += mb_w;
  }

  mem = (uint8_t*)WEBP_ALIGN(mem);
  assert((yuv_size & WEBP_ALIGN_CST) == 0);
  dec->yuv_b_ = mem;
  mem += yuv_size;

  dec->mb_data_ = (VP8MBData*)mem;
  dec->thread_ctx_.mb_data_ = (VP8MBData*)mem;
  if (dec->mt_method_ == 2) {
    dec->thread_ctx_.mb_data_ += mb_w;
  }
  mem += mb_data_size;

  dec->cache_y_stride_ = 16 * mb_w;
  dec->cache_uv_stride_ = 8 * mb_w;
  {
    const int extra_rows = kFilterExtraRows[dec->filter_type_];
    const int extra_y = extra_rows * dec->cache_y_stride_;
    const int extra_uv = (extra_rows / 2) * dec->cache_uv_stride_;
    dec->cache_y_ = mem + extra_y;
    dec->cache_u_ = dec->cache_y_
                  + 16 * num_caches * dec->cache_y_stride_ + extra_uv;
    dec->cache_v_ = dec->cache_u_
                  + 8 * num_caches * dec->cache_uv_stride_ + extra_uv;
    dec->cache_id_ = 0;
  }
  mem += cache_size;

  // alpha plane
  dec->alpha_plane_ = alpha_size ? mem : NULL;
  mem += alpha_size;
  assert(mem <= (uint8_t*)dec->mem_ + dec->mem_size_);

  // note: left/top-info is initialized once for all.
  memset(dec->mb_info_ - 1, 0, mb_info_size);
  VP8InitScanline(dec);   // initialize left too.

  // initialize top
  memset(dec->intra_t_, B_DC_PRED, intra_pred_mode_size);

  return 1;
}